

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O2

void __thiscall leveldb::Block::Iter::SeekToRestartPoint(Iter *this,uint32_t index)

{
  long lVar1;
  uint32_t uVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->key_)._M_string_length = 0;
  *(this->key_)._M_dataplus._M_p = '\0';
  this->restart_index_ = index;
  uVar2 = GetRestartPoint(this,index);
  (this->value_).data_ = this->data_ + uVar2;
  (this->value_).size_ = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SeekToRestartPoint(uint32_t index) {
    key_.clear();
    restart_index_ = index;
    // current_ will be fixed by ParseNextKey();

    // ParseNextKey() starts at the end of value_, so set value_ accordingly
    uint32_t offset = GetRestartPoint(index);
    value_ = Slice(data_ + offset, 0);
  }